

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_exec(Context *context,IntrinsicResult *partialResult)

{
  byte bVar1;
  long lVar2;
  ListStorage<MiniScript::TACLine> *pLVar3;
  bool bVar4;
  uint uVar5;
  IntrinsicResultStorage *pIVar6;
  undefined4 *puVar7;
  anon_union_8_3_2f476f46_for_data aVar8;
  _func_int **pp_Var9;
  long lVar10;
  long *plVar11;
  long *plVar12;
  long *in_RDX;
  long *plVar13;
  double dVar14;
  String stdErr;
  String stdOut;
  int status;
  anon_union_8_3_2f476f46_for_data local_f8;
  long *local_f0;
  Value local_e8;
  long *local_d8;
  long *local_d0;
  anon_union_8_3_2f476f46_for_data local_c8;
  char local_c0;
  anon_union_8_3_2f476f46_for_data local_b8;
  long *local_b0;
  int local_a4;
  anon_union_8_3_2f476f46_for_data local_a0;
  anon_union_8_3_2f476f46_for_data local_98;
  anon_union_8_3_2f476f46_for_data local_90;
  long *local_88;
  anon_union_8_3_2f476f46_for_data local_80;
  char local_78;
  anon_union_8_3_2f476f46_for_data local_70;
  char local_68;
  Value local_60;
  anon_union_8_3_2f476f46_for_data local_50;
  char local_48;
  IntrinsicResult local_40;
  char local_38;
  
  pIVar6 = partialResult[0xe].rs;
  dVar14 = *(double *)&pIVar6[3].result;
  local_d8 = (long *)0x0;
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    dVar14 = MiniScript::Machine::CurrentWallClockTime();
    local_d8 = (long *)(dVar14 - *(double *)&pIVar6[3].result);
  }
  lVar10 = *in_RDX;
  if ((lVar10 == 0) || (*(char *)(lVar10 + 0x10) == '\x01')) {
    local_38 = '\0';
    pIVar6 = (IntrinsicResultStorage *)operator_new(0x30);
    (pIVar6->super_RefCountedStorage).refCount = 1;
    (pIVar6->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    (pIVar6->result).type = List;
    (pIVar6->result).noInvoke = false;
    (pIVar6->result).localOnly = Off;
    *(undefined5 *)&(pIVar6->result).field_0x3 = 0;
    (pIVar6->result).data.number = -NAN;
    puVar7 = (undefined4 *)operator_new__(4);
    *(undefined4 **)&pIVar6->done = puVar7;
    *puVar7 = 0x646d63;
    local_40.rs = pIVar6;
    MiniScript::Context::GetVar
              ((Context *)&local_f8,(String *)partialResult,(LocalOnlyMode)&local_40);
    MiniScript::Value::ToString((Value *)&local_c8,(Machine *)&local_f8);
    if ((2 < (byte)local_f8.tempNum._0_1_) && (local_f0 != (long *)0x0)) {
      plVar12 = local_f0 + 1;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (**(code **)(*local_f0 + 8))();
      }
      local_f0 = (long *)0x0;
    }
    if ((local_40.rs != (IntrinsicResultStorage *)0x0) && (local_38 == '\0')) {
      plVar12 = &((local_40.rs)->super_RefCountedStorage).refCount;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (*((local_40.rs)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_40.rs = (IntrinsicResultStorage *)0x0;
    }
    local_48 = '\0';
    aVar8.ref = (RefCountedStorage *)operator_new(0x30);
    (aVar8.ref)->refCount = 1;
    (aVar8.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    aVar8.ref[1].refCount = 8;
    aVar8.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    pp_Var9 = (_func_int **)operator_new__(8);
    aVar8.ref[1]._vptr_RefCountedStorage = pp_Var9;
    *pp_Var9 = (_func_int *)0x74756f656d6974;
    local_50.ref = aVar8.ref;
    MiniScript::Context::GetVar
              ((Context *)&local_b8,(String *)partialResult,(LocalOnlyMode)&local_50);
    plVar12 = local_b0;
    if (local_b8.tempNum._0_1_ != 1) {
      plVar12 = (long *)0x0;
    }
    if (local_b0 != (long *)0x0 && 2 < (byte)local_b8.tempNum._0_1_) {
      plVar11 = local_b0 + 1;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        local_d0 = plVar12;
        (**(code **)(*local_b0 + 8))();
        plVar12 = local_d0;
      }
      local_b0 = (long *)0x0;
    }
    if ((local_50.ref != (RefCountedStorage *)0x0) && (local_48 == '\0')) {
      plVar11 = &(local_50.ref)->refCount;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        local_d0 = plVar12;
        (*(local_50.ref)->_vptr_RefCountedStorage[1])();
        plVar12 = local_d0;
      }
      local_50.number = 0.0;
    }
    local_f8.number = 0.0;
    local_f0 = (long *)((ulong)local_f0 & 0xffffffffffffff00);
    local_68 = '\0';
    local_70.number = local_c8.number;
    if (local_c8.ref != (RefCountedStorage *)0x0) {
      (local_c8.ref)->refCount = (local_c8.ref)->refCount + 1;
    }
    bVar4 = MiniScript::BeginExec
                      ((String *)&local_70,(double)plVar12,(double)local_d8,(ValueList *)&local_f8);
    if ((local_70.ref != (RefCountedStorage *)0x0) && (local_68 == '\0')) {
      plVar12 = &(local_70.ref)->refCount;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (*(local_70.ref)->_vptr_RefCountedStorage[1])();
      }
      local_70.number = 0.0;
    }
    if (bVar4) {
      local_60.type = List;
      local_60.noInvoke = false;
      local_60.localOnly = Off;
      if (local_f8.ref == (RefCountedStorage *)0x0) {
        local_f8.ref = (RefCountedStorage *)operator_new(0x30);
        (local_f8.ref)->refCount = 1;
        ((RefCountedStorage *)((long)local_f8 + 0x10))->_vptr_RefCountedStorage = (_func_int **)0x0;
        ((RefCountedStorage *)((long)local_f8 + 0x10))->refCount = 0;
        ((RefCountedStorage *)((long)local_f8 + 0x20))->_vptr_RefCountedStorage = (_func_int **)0x0;
        ((RefCountedStorage *)((long)local_f8 + 0x20))->refCount = 0;
        (local_f8.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__ListStorage_001bf138;
      }
      (local_f8.ref)->refCount = (local_f8.ref)->refCount + 1;
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      local_60.data = local_f8;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_60);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           0;
      if ((Temp < local_60.type) && (local_60.data.ref != (RefCountedStorage *)0x0)) {
        plVar12 = &(local_60.data.ref)->refCount;
        *plVar12 = *plVar12 + -1;
        if (*plVar12 == 0) {
          (*(local_60.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_60.data.number = 0.0;
      }
    }
    else {
      MiniScript::IntrinsicResult::ensureStorage
                ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
      pLVar3 = MiniScript::IntrinsicResult::Null;
      (context->code).ls = MiniScript::IntrinsicResult::Null;
      if (pLVar3 != (ListStorage<MiniScript::TACLine> *)0x0) {
        plVar12 = &(pLVar3->super_RefCountedStorage).refCount;
        *plVar12 = *plVar12 + 1;
      }
    }
    if ((local_f8.ref != (RefCountedStorage *)0x0) && ((char)local_f0 == '\0')) {
      plVar12 = &(local_f8.ref)->refCount;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (*(local_f8.ref)->_vptr_RefCountedStorage[1])();
      }
    }
    if (local_c8.ref == (RefCountedStorage *)0x0) {
      return (IntrinsicResult)(IntrinsicResultStorage *)context;
    }
    if (local_c0 != '\0') {
      return (IntrinsicResult)(IntrinsicResultStorage *)context;
    }
    plVar12 = &(local_c8.ref)->refCount;
    *plVar12 = *plVar12 + -1;
    if (*plVar12 != 0) {
      return (IntrinsicResult)(IntrinsicResultStorage *)context;
    }
    pp_Var9 = (local_c8.ref)->_vptr_RefCountedStorage;
    aVar8 = local_c8;
    goto LAB_0012ef03;
  }
  bVar1 = *(byte *)(lVar10 + 0x18);
  aVar8 = (anon_union_8_3_2f476f46_for_data)
          ((anon_union_8_3_2f476f46_for_data *)(lVar10 + 0x20))->ref;
  if (aVar8.ref != (RefCountedStorage *)0x0 && 2 < bVar1) {
    (aVar8.ref)->refCount = (aVar8.ref)->refCount + 1;
  }
  if (bVar1 == 4) {
    if (aVar8.ref == (RefCountedStorage *)0x0) goto LAB_0012e970;
    lVar2 = (aVar8.ref)->refCount;
    (aVar8.ref)->refCount = lVar2 + 1;
LAB_0012e92f:
    lVar10 = lVar2;
    (aVar8.ref)->refCount = lVar10;
    if (lVar10 == 0) {
      (*(aVar8.ref)->_vptr_RefCountedStorage[1])(aVar8.number);
      lVar10 = (aVar8.ref)->refCount;
    }
LAB_0012e948:
    local_b8.number = 0.0;
    local_b0 = (long *)((ulong)local_b0 & 0xffffffffffffff00);
    local_c8.number = 0.0;
    local_c0 = '\0';
    local_a4 = -1;
    local_78 = '\0';
    lVar10 = lVar10 + 1;
  }
  else {
    MiniScript::_Error("Assert failed: type == ValueType::List",
                       "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/MiniscriptTypes.h"
                       ,0x94);
    if (aVar8.ref != (RefCountedStorage *)0x0) {
      lVar2 = (aVar8.ref)->refCount;
      lVar10 = lVar2 + 1;
      (aVar8.ref)->refCount = lVar10;
      if (2 < bVar1) goto LAB_0012e92f;
      goto LAB_0012e948;
    }
LAB_0012e970:
    local_b8.number = 0.0;
    local_b0 = (long *)((ulong)local_b0 & 0xffffffffffffff00);
    local_c8.number = 0.0;
    local_c0 = '\0';
    local_a4 = -1;
    local_78 = '\0';
    aVar8.ref = (RefCountedStorage *)operator_new(0x30);
    (aVar8.ref)->refCount = 1;
    aVar8.ref[1]._vptr_RefCountedStorage = (_func_int **)0x0;
    aVar8.ref[1].refCount = 0;
    aVar8.ref[2]._vptr_RefCountedStorage = (_func_int **)0x0;
    aVar8.ref[2].refCount = 0;
    (aVar8.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__ListStorage_001bf138;
    lVar10 = 2;
  }
  (aVar8.ref)->refCount = lVar10;
  local_80 = aVar8;
  bVar4 = MiniScript::FinishExec
                    ((ValueList *)&local_80,(double)local_d8,(String *)&local_b8,(String *)&local_c8
                     ,&local_a4);
  if ((local_80.ref != (RefCountedStorage *)0x0) && (local_78 == '\0')) {
    plVar12 = &(local_80.ref)->refCount;
    *plVar12 = *plVar12 + -1;
    if (*plVar12 == 0) {
      (*(local_80.ref)->_vptr_RefCountedStorage[1])();
      local_80.number = 0.0;
    }
  }
  if (bVar4) {
    MiniScript::Value::Value((Value *)&local_f8,"output");
    local_e8.type = String;
    local_e8.noInvoke = false;
    local_e8.localOnly = Off;
    local_e8.data = local_b8;
    if (local_b8.ref == (RefCountedStorage *)0x0) {
      local_e8.data = DAT_001c1308;
    }
    if (local_e8.data.ref != (RefCountedStorage *)0x0) {
      (local_e8.data.ref)->refCount = (local_e8.data.ref)->refCount + 1;
    }
    local_d8 = (long *)0x0;
    uVar5 = MiniScript::HashValue((Value *)&local_f8);
    local_d8 = (long *)0x0;
    plVar11 = (long *)operator_new(0x800);
    plVar11[1] = 1;
    *plVar11 = (long)&PTR__DictionaryStorage_001bf208;
    local_d0 = plVar11 + 2;
    local_d8 = plVar11;
    memset(local_d0,0,0x7f0);
    plVar13 = plVar11 + (ulong)(uVar5 % 0xfb) + 3;
    plVar12 = plVar13;
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) {
        plVar12 = (long *)operator_new(0x28);
        *(undefined2 *)(plVar12 + 3) = 0;
        *(undefined1 *)((long)plVar12 + 0x1a) = 0;
        *plVar12 = 0;
        *(undefined4 *)((long)plVar12 + 7) = 0;
        MiniScript::Value::operator=((Value *)(plVar12 + 1),(Value *)&local_f8);
        MiniScript::Value::operator=((Value *)(plVar12 + 3),&local_e8);
        *plVar12 = *plVar13;
        *plVar13 = (long)plVar12;
        *local_d0 = *local_d0 + 1;
        goto LAB_0012ebd5;
      }
      bVar4 = MiniScript::Value::operator==((Value *)(plVar12 + 1),(Value *)&local_f8);
    } while (!bVar4);
    MiniScript::Value::operator=((Value *)(plVar12 + 3),&local_e8);
LAB_0012ebd5:
    if ((Temp < local_e8.type) && (local_e8.data.ref != (RefCountedStorage *)0x0)) {
      plVar12 = &(local_e8.data.ref)->refCount;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (*(local_e8.data.ref)->_vptr_RefCountedStorage[1])();
      }
    }
    if ((2 < (byte)local_f8.tempNum._0_1_) && (local_f0 != (long *)0x0)) {
      plVar12 = local_f0 + 1;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (**(code **)(*local_f0 + 8))();
      }
    }
    MiniScript::Value::Value((Value *)&local_f8,"errors");
    local_e8.type = String;
    local_e8.noInvoke = false;
    local_e8.localOnly = Off;
    local_e8.data = local_c8;
    if (local_c8.ref == (RefCountedStorage *)0x0) {
      local_e8.data = DAT_001c1308;
    }
    if (local_e8.data.ref != (RefCountedStorage *)0x0) {
      (local_e8.data.ref)->refCount = (local_e8.data.ref)->refCount + 1;
    }
    uVar5 = MiniScript::HashValue((Value *)&local_f8);
    plVar13 = plVar11 + (ulong)(uVar5 % 0xfb) + 3;
    plVar12 = plVar13;
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) {
        plVar12 = (long *)operator_new(0x28);
        *(undefined2 *)(plVar12 + 3) = 0;
        *(undefined1 *)((long)plVar12 + 0x1a) = 0;
        *plVar12 = 0;
        *(undefined4 *)((long)plVar12 + 7) = 0;
        MiniScript::Value::operator=((Value *)(plVar12 + 1),(Value *)&local_f8);
        MiniScript::Value::operator=((Value *)(plVar12 + 3),&local_e8);
        *plVar12 = *plVar13;
        *plVar13 = (long)plVar12;
        *local_d0 = *local_d0 + 1;
        goto LAB_0012ecfc;
      }
      bVar4 = MiniScript::Value::operator==((Value *)(plVar12 + 1),(Value *)&local_f8);
    } while (!bVar4);
    MiniScript::Value::operator=((Value *)(plVar12 + 3),&local_e8);
LAB_0012ecfc:
    if ((Temp < local_e8.type) && (local_e8.data.ref != (RefCountedStorage *)0x0)) {
      plVar12 = &(local_e8.data.ref)->refCount;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (*(local_e8.data.ref)->_vptr_RefCountedStorage[1])();
      }
    }
    if ((2 < (byte)local_f8.tempNum._0_1_) && (local_f0 != (long *)0x0)) {
      plVar12 = local_f0 + 1;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (**(code **)(*local_f0 + 8))();
      }
    }
    MiniScript::Value::Value((Value *)&local_f8,"status");
    local_e8.data.number = (double)local_a4;
    local_e8.type = Number;
    local_e8.noInvoke = false;
    local_e8.localOnly = Off;
    uVar5 = MiniScript::HashValue((Value *)&local_f8);
    plVar11 = plVar11 + (ulong)(uVar5 % 0xfb) + 3;
    plVar12 = plVar11;
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) {
        plVar12 = (long *)operator_new(0x28);
        *(undefined2 *)(plVar12 + 3) = 0;
        *(undefined1 *)((long)plVar12 + 0x1a) = 0;
        *plVar12 = 0;
        *(undefined4 *)((long)plVar12 + 7) = 0;
        MiniScript::Value::operator=((Value *)(plVar12 + 1),(Value *)&local_f8);
        MiniScript::Value::operator=((Value *)(plVar12 + 3),&local_e8);
        *plVar12 = *plVar11;
        *plVar11 = (long)plVar12;
        *local_d0 = *local_d0 + 1;
        goto LAB_0012ee0c;
      }
      bVar4 = MiniScript::Value::operator==((Value *)(plVar12 + 1),(Value *)&local_f8);
    } while (!bVar4);
    MiniScript::Value::operator=((Value *)(plVar12 + 3),&local_e8);
LAB_0012ee0c:
    if ((Temp < local_e8.type) && (local_e8.data.ref != (RefCountedStorage *)0x0)) {
      plVar12 = &(local_e8.data.ref)->refCount;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (*(local_e8.data.ref)->_vptr_RefCountedStorage[1])();
      }
    }
    if ((2 < (byte)local_f8.tempNum._0_1_) && (local_f0 != (long *)0x0)) {
      plVar12 = local_f0 + 1;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (**(code **)(*local_f0 + 8))();
      }
    }
    local_90.tempNum._0_2_ = 5;
    local_90.tempNum._2_1_ = 0;
    local_88 = local_d8;
    local_d8[1] = local_d8[1] + 1;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               (Value *)&local_90);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((2 < (byte)local_90.tempNum._0_1_) && (local_88 != (long *)0x0)) {
      plVar12 = local_88 + 1;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (**(code **)(*local_88 + 8))();
      }
      local_88 = (long *)0x0;
    }
    plVar12 = local_d8 + 1;
    *plVar12 = *plVar12 + -1;
    if (*plVar12 == 0) {
      (**(code **)(*local_d8 + 8))();
    }
  }
  else {
    local_a0.tempNum._0_2_ = 4;
    local_a0.tempNum._2_1_ = 0;
    (aVar8.ref)->refCount = (aVar8.ref)->refCount + 1;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    local_98 = aVar8;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               (Value *)&local_a0);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 0;
    if ((2 < (byte)local_a0.tempNum._0_1_) && (local_98.ref != (RefCountedStorage *)0x0)) {
      plVar12 = &(local_98.ref)->refCount;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (*(local_98.ref)->_vptr_RefCountedStorage[1])();
      }
      local_98.number = 0.0;
    }
  }
  if ((local_c8.ref != (RefCountedStorage *)0x0) && (local_c0 == '\0')) {
    plVar12 = &(local_c8.ref)->refCount;
    *plVar12 = *plVar12 + -1;
    if (*plVar12 == 0) {
      (*(local_c8.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  if ((local_b8.ref != (RefCountedStorage *)0x0) && ((char)local_b0 == '\0')) {
    plVar12 = &(local_b8.ref)->refCount;
    *plVar12 = *plVar12 + -1;
    if (*plVar12 == 0) {
      (*(local_b8.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  plVar12 = &(aVar8.ref)->refCount;
  *plVar12 = *plVar12 + -1;
  if (*plVar12 != 0) {
    return (IntrinsicResult)(IntrinsicResultStorage *)context;
  }
  pp_Var9 = (aVar8.ref)->_vptr_RefCountedStorage;
LAB_0012ef03:
  (*pp_Var9[1])(aVar8.number);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_exec(Context *context, IntrinsicResult partialResult) {
	double now = context->vm->RunTime();
	if (partialResult.Done()) {
		// This is the initial entry into `exec`.  Fork a subprocess to execute the
		// given command, and return a partial result we can use to check on its progress.
		String cmd = context->GetVar("cmd").ToString();
		double timeout = context->GetVar("timeout").DoubleValue();
		ValueList data;
		if (BeginExec(cmd, timeout, now, &data)) {
			return IntrinsicResult(data, false);
		}
		return IntrinsicResult::Null;
	}
	
	// This is a subsequent entry to intrinsic_exec, where we've already forked
	// the subprocess, and now we're waiting for it to finish.	al time out of the partial result.
	ValueList data = partialResult.Result().GetList();
	String stdOut, stdErr;
	int status = -1;
	if (FinishExec(data, now, &stdOut, &stdErr, &status)) {
		// All done!
		ValueDict result;
		result.SetValue("output", Value(stdOut));
		result.SetValue("errors", Value(stdErr));
		result.SetValue("status", Value(status));
		return IntrinsicResult(result);
	} else {
		// Not done yet.
		return IntrinsicResult(data, false);
	}
}